

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

ll_node * ll_create_node(void *ptr,size_t isize)

{
  ll_node *plVar1;
  void *__dest;
  
  if (isize == 0 || ptr == (void *)0x0) {
    plVar1 = (ll_node *)0x0;
  }
  else {
    plVar1 = (ll_node *)xmalloc(0x18);
    plVar1->next = (ll_node *)0x0;
    __dest = xmalloc(isize);
    plVar1->value_ptr = __dest;
    plVar1->value_size = isize;
    memcpy(__dest,ptr,isize);
  }
  return plVar1;
}

Assistant:

struct ll_node *ll_create_node(const void *ptr, size_t isize)
{
	if (ptr == NULL || isize <= 0) {
		return NULL;
	}
	struct ll_node *node = xmalloc(sizeof(struct ll_node));
	node->next = NULL;
	node->value_ptr = xmalloc(isize);
	node->value_size = isize;
	memcpy(node->value_ptr, ptr, isize);
	return node;
}